

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O0

bool __thiscall CaptureSummary::Merge(CaptureSummary *this,char *list_file_name)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  char *pcVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  CaptureSummary **cs;
  CaptureSummary *pCVar8;
  bool bVar9;
  char **local_2d8;
  FILE *local_2c0;
  size_t i_3;
  size_t i_2;
  size_t first_file;
  size_t j;
  ulong local_290;
  size_t i_1;
  CaptureSummary **intermediate_list;
  size_t nb_created;
  size_t nb_intermediate_summaries;
  size_t nb_compiled;
  size_t i;
  char **new_list;
  size_t new_len;
  size_t len;
  undefined8 uStack_240;
  bool ret;
  size_t batch_size;
  char buffer [512];
  FILE *F;
  size_t nb_files;
  char **file_list;
  size_t nb_alloc;
  char *list_file_name_local;
  CaptureSummary *this_local;
  
  file_list = (char **)0x0;
  nb_files = 0;
  F = (FILE *)0x0;
  uStack_240 = 0x80;
  buffer._504_8_ = ithi_file_open(list_file_name,"r");
  len._7_1_ = (FILE *)buffer._504_8_ != (FILE *)0x0;
  while( true ) {
    bVar9 = false;
    if (len._7_1_ != false) {
      pcVar4 = fgets((char *)&batch_size,0x200,(FILE *)buffer._504_8_);
      bVar9 = pcVar4 != (char *)0x0;
    }
    if (!bVar9) break;
    new_len = strlen((char *)&batch_size);
    while( true ) {
      bVar9 = false;
      if ((((new_len != 0) && (bVar9 = true, (&ret)[new_len] != true)) &&
          (bVar9 = true, (&ret)[new_len] != true)) && (bVar9 = true, (&ret)[new_len] != true)) {
        bVar9 = (&ret)[new_len] == true;
      }
      if (!bVar9) break;
      buffer[new_len - 8] = '\0';
      new_len = new_len - 1;
    }
    if (new_len != 0) {
      if (file_list <= F) {
        if (file_list == (char **)0x0) {
          local_2d8 = (char **)0x200;
        }
        else {
          local_2d8 = (char **)((long)file_list << 1);
        }
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_2d8;
        uVar6 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar6 = 0xffffffffffffffff;
        }
        pvVar5 = operator_new__(uVar6);
        if (pvVar5 == (void *)0x0) {
          len._7_1_ = false;
        }
        else {
          nb_compiled = 0;
          while (nb_compiled < file_list) {
            *(undefined8 *)((long)pvVar5 + nb_compiled * 8) =
                 *(undefined8 *)(nb_files + nb_compiled * 8);
            *(undefined8 *)(nb_files + nb_compiled * 8) = 0;
            nb_compiled = nb_compiled + 1;
          }
          while (nb_compiled < local_2d8) {
            *(undefined8 *)((long)pvVar5 + nb_compiled * 8) = 0;
            nb_compiled = nb_compiled + 1;
          }
          if ((nb_files != 0) && (nb_files != 0)) {
            operator_delete__((void *)nb_files);
          }
          file_list = local_2d8;
          nb_files = (size_t)pvVar5;
        }
      }
      if (len._7_1_ != false) {
        pvVar5 = operator_new__(new_len + 1);
        *(void **)(nb_files + (long)F * 8) = pvVar5;
        if (*(long *)(nb_files + (long)F * 8) == 0) {
          len._7_1_ = false;
        }
        else {
          memcpy(*(void **)(nb_files + (long)F * 8),&batch_size,new_len);
          *(undefined1 *)(*(long *)(nb_files + (long)F * 8) + new_len) = 0;
          F = F + 1;
        }
      }
    }
  }
  if (len._7_1_ != false) {
    if (F < (FILE *)0x81) {
      len._7_1_ = Merge(this,(size_t)F,(char **)nb_files);
    }
    else {
      nb_intermediate_summaries = 0;
      uVar6 = (ulong)(F + 0x7f) >> 7;
      intermediate_list = (CaptureSummary **)0x0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar6;
      uVar7 = SUB168(auVar2 * ZEXT816(8),0);
      if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      cs = (CaptureSummary **)operator_new__(uVar7);
      if (cs == (CaptureSummary **)0x0) {
        len._7_1_ = false;
      }
      else {
        for (local_290 = 0; sVar3 = nb_intermediate_summaries,
            len._7_1_ != false && local_290 < uVar6; local_290 = local_290 + 1) {
          pCVar8 = (CaptureSummary *)operator_new(0x20);
          CaptureSummary(pCVar8);
          cs[local_290] = pCVar8;
          if (cs[local_290] == (CaptureSummary *)0x0) {
            len._7_1_ = false;
            for (first_file = (size_t)intermediate_list; first_file < uVar6;
                first_file = first_file + 1) {
              cs[first_file] = (CaptureSummary *)0x0;
            }
          }
          else {
            intermediate_list = (CaptureSummary **)((long)intermediate_list + 1);
            nb_intermediate_summaries = nb_intermediate_summaries + 0x80;
            if (F < nb_intermediate_summaries) {
              nb_intermediate_summaries = (size_t)F;
            }
            len._7_1_ = Merge(cs[local_290],nb_intermediate_summaries - sVar3,
                              (char **)(nb_files + sVar3 * 8));
          }
        }
        if (len._7_1_ != false) {
          len._7_1_ = Merge(this,uVar6,cs);
        }
        for (i_3 = 0; i_3 < uVar6; i_3 = i_3 + 1) {
          if (cs[i_3] != (CaptureSummary *)0x0) {
            pCVar8 = cs[i_3];
            if (pCVar8 != (CaptureSummary *)0x0) {
              ~CaptureSummary(pCVar8);
              operator_delete(pCVar8);
            }
            cs[i_3] = (CaptureSummary *)0x0;
          }
        }
        if (cs != (CaptureSummary **)0x0) {
          operator_delete__(cs);
        }
      }
    }
  }
  if (nb_files != 0) {
    for (local_2c0 = (FILE *)0x0; local_2c0 < F; local_2c0 = local_2c0 + 1) {
      pvVar5 = *(void **)(nb_files + (long)local_2c0 * 8);
      if (pvVar5 != (void *)0x0) {
        operator_delete__(pvVar5);
      }
      *(undefined8 *)(nb_files + (long)local_2c0 * 8) = 0;
    }
    if (nb_files != 0) {
      operator_delete__((void *)nb_files);
    }
  }
  if (buffer._504_8_ != 0) {
    fclose((FILE *)buffer._504_8_);
  }
  return len._7_1_;
}

Assistant:

bool CaptureSummary::Merge(char const * list_file_name)
{
    size_t nb_alloc = 0;
    char ** file_list = NULL;
    size_t nb_files = 0;
    FILE* F;
    char buffer[512];
    const size_t batch_size = 128;

    /* Open the list file */
    bool ret;
    F = ithi_file_open(list_file_name, "r");
    ret = (F != NULL);

    /* Read each file name and add it to the list */
    while (ret && fgets(buffer, sizeof(buffer), F) != NULL) {
        /* Clean up the end of the buffer */
        size_t len = strlen(buffer);

        while (len > 0 && (buffer[len-1] == ' ' || buffer[len-1] == '\t' || buffer[len-1] == '\r' || buffer[len-1] == '\n')) {
            buffer[len--] = 0;
        }

        if (len == 0)
        {
            continue;
        }

        /* Allocate memory if necessary */
        if (nb_files >= nb_alloc) {
            size_t new_len = (nb_alloc == 0) ? 512 : 2 * nb_alloc;
            char ** new_list = new char*[new_len];

            if (new_list == NULL) {
                ret = false;
            }
            else
            {
                size_t i = 0;
                while (i < nb_alloc){
                    new_list[i] = file_list[i];
                    file_list[i++] = NULL;
                }
                while (i < new_len) {
                    new_list[i++] = NULL;
                }

                if (file_list != NULL) {
                    delete[] file_list;
                }
                file_list = new_list;
                nb_alloc = new_len;
            }
        }

        /* Record the name */
        if (ret)
        {
            file_list[nb_files] = new char[len + 1];
            if (file_list[nb_files] == NULL)
            {
                ret = false;
            }
            else
            {
                memcpy(file_list[nb_files], buffer, len);
                file_list[nb_files][len] = 0;
                nb_files++;
            }
        }
    }


    /* Merge the list */
    if (ret)
    {
        /* Create intermediate merge files if there are more than 100 summaries */
        if (nb_files > batch_size) {
            size_t nb_compiled = 0;
            size_t nb_intermediate_summaries = (nb_files + batch_size - 1) / batch_size;
            size_t nb_created = 0;
            CaptureSummary** intermediate_list = new  CaptureSummary * [nb_intermediate_summaries];

            if (intermediate_list == NULL) {
                ret = false;
            }
            else {
                for (size_t i = 0; ret && i < nb_intermediate_summaries; i++) {
                    intermediate_list[i] = new CaptureSummary();
                    if (intermediate_list[i] == NULL) {
                        ret = false;
                        for (size_t j = nb_created; j < nb_intermediate_summaries; j++) {
                            intermediate_list[j] = NULL;
                        }
                    }
                    else {
                        nb_created++;
                        size_t first_file = nb_compiled;
                        nb_compiled += batch_size;
                        if (nb_compiled > nb_files) {
                            nb_compiled = nb_files;
                        }
                        ret = intermediate_list[i]->Merge(nb_compiled - first_file, (char const**)(file_list + first_file));
                    }
                }

                if (ret) {
                    /* Merge all the summaries */
                    ret = Merge(nb_intermediate_summaries, intermediate_list);
                }
                /* Clean up all the intermediate summaries */
                for (size_t i = 0; i < nb_intermediate_summaries; i++) {
                    if (intermediate_list[i] != NULL) {
                        delete intermediate_list[i];
                        intermediate_list[i] = NULL;
                    }
                }
                delete[] intermediate_list;
            }
        }
        else {
            ret = Merge(nb_files, (char const**)file_list);
        }
    }

    /* Clean up */
    if (file_list != NULL)
    {
        for (size_t i = 0; i < nb_files; i++)
        {
            delete[] file_list[i];
            file_list[i] = NULL;
        }

        delete[] file_list;
    }

    if (F != NULL)
    {
        fclose(F);
    }

    return ret;
}